

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int eval_unary_expr(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                   lyxp_set *set,int options)

{
  ushort exp_idx_00;
  uint16_t uVar1;
  uint16_t uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  lyxp_set *set_00;
  undefined1 auStack_c8 [8];
  lyxp_set orig_set;
  lyxp_set set2;
  
  pcVar6 = "parsed";
  if (set == (lyxp_set *)0x0) {
    pcVar6 = "skipped";
  }
  exp_idx_00 = *exp_idx;
  uVar8 = 0xffffffff;
  while( true ) {
    uVar7 = (ulong)exp_idx_00;
    iVar4 = (int)uVar8;
    if (((exp->used == exp_idx_00) || (exp->tokens[uVar7] != LYXP_TOKEN_OPERATOR_MATH)) ||
       (exp->expr[exp->expr_pos[uVar7]] != '-')) break;
    uVar8 = uVar7;
    if (iVar4 != -1) {
      uVar8 = 0xffffffff;
    }
    if ('\x02' < ly_log_level) {
      ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_unary_expr",pcVar6,"Operator(Math)");
      exp_idx_00 = *exp_idx;
    }
    exp_idx_00 = exp_idx_00 + 1;
    *exp_idx = exp_idx_00;
  }
  orig_set.val._8_8_ = 0;
  orig_set.used = 0;
  orig_set.size = 0;
  orig_set._8_8_ = 0;
  orig_set.val.nodes = (lyxp_set_nodes *)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  orig_set.type = LYXP_SET_EMPTY;
  orig_set._4_4_ = 0;
  orig_set.ctx_pos = 0;
  orig_set.ctx_size = 0;
  uVar1 = exp_repeat_peek(exp,exp_idx_00);
  if ((uVar1 == 0) || (uVar7 = (ulong)uVar1, exp->tokens[uVar7] != LYXP_TOKEN_OPERATOR_UNI)) {
    uVar7 = 0;
  }
  else {
    exp_repeat_pop(exp,exp_idx_00);
    set_fill_set((lyxp_set *)auStack_c8,set);
  }
  iVar3 = eval_path_expr(exp,exp_idx,cur_node,param_4,set,options);
  if (iVar3 == 0) {
    do {
      while( true ) {
        while( true ) {
          if ((short)uVar7 == 0) {
            lyxp_set_cast((lyxp_set *)auStack_c8,LYXP_SET_EMPTY,cur_node,param_4,options);
            if ((options & 0x1cU) != 0) {
              return 0;
            }
            if (set == (lyxp_set *)0x0) {
              return 0;
            }
            if (iVar4 < 0) {
              return 0;
            }
            iVar4 = moveto_op_math(set,(lyxp_set *)0x0,exp->expr + exp->expr_pos[uVar8],cur_node,
                                   param_4,options);
            if (iVar4 == 0) {
              return 0;
            }
            goto LAB_00163ebf;
          }
          if ('\x02' < ly_log_level) {
            pcVar5 = print_token(exp->tokens[*exp_idx]);
            ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_unary_expr",pcVar6,pcVar5,
                       (ulong)exp->expr_pos[*exp_idx]);
          }
          uVar1 = *exp_idx + 1;
          *exp_idx = uVar1;
          uVar2 = exp_repeat_peek(exp,uVar1);
          if ((uVar2 == 0) || (uVar7 = (ulong)uVar2, exp->tokens[uVar7] != LYXP_TOKEN_OPERATOR_UNI))
          {
            uVar7 = 0;
          }
          else {
            exp_repeat_pop(exp,uVar1);
          }
          if (set != (lyxp_set *)0x0) break;
          iVar3 = eval_path_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
          if (iVar3 != 0) {
            return iVar3;
          }
        }
        set_fill_set((lyxp_set *)&orig_set.ctx_pos,(lyxp_set *)auStack_c8);
        iVar3 = eval_path_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)&orig_set.ctx_pos,options);
        if (iVar3 != 0) {
          lyxp_set_cast((lyxp_set *)auStack_c8,LYXP_SET_EMPTY,cur_node,param_4,options);
          set_00 = (lyxp_set *)&orig_set.ctx_pos;
          goto LAB_00163cc2;
        }
        if ((options & 0x1cU) == 0) break;
        set_snode_merge(set,(lyxp_set *)&orig_set.ctx_pos);
      }
      iVar3 = moveto_union(set,(lyxp_set *)&orig_set.ctx_pos,cur_node,options);
    } while (iVar3 == 0);
    lyxp_set_cast((lyxp_set *)auStack_c8,LYXP_SET_EMPTY,cur_node,param_4,options);
    lyxp_set_cast((lyxp_set *)&orig_set.ctx_pos,LYXP_SET_EMPTY,cur_node,param_4,options);
LAB_00163ebf:
    iVar3 = -1;
  }
  else {
    set_00 = (lyxp_set *)auStack_c8;
LAB_00163cc2:
    lyxp_set_cast(set_00,LYXP_SET_EMPTY,cur_node,param_4,options);
  }
  return iVar3;
}

Assistant:

static int
eval_unary_expr(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
                struct lyxp_set *set, int options)
{
    int unary_minus, ret;
    uint16_t op_exp;
    struct lyxp_set orig_set, set2;

    /* ('-')* */
    unary_minus = -1;
    while (!exp_check_token(exp, *exp_idx, LYXP_TOKEN_OPERATOR_MATH, 0)
            && (exp->expr[exp->expr_pos[*exp_idx]] == '-')) {
        if (unary_minus == -1) {
            unary_minus = *exp_idx;
        } else {
            /* double '-' makes '+', ignore */
            unary_minus = -1;
        }
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);
    }

    memset(&orig_set, 0, sizeof orig_set);
    memset(&set2, 0, sizeof set2);

    op_exp = exp_repeat_peek(exp, *exp_idx);
    if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_UNI)) {
        /* there is an operator */
        exp_repeat_pop(exp, *exp_idx);
        set_fill_set(&orig_set, set);
    } else {
        op_exp = 0;
    }

    /* PathExpr */
    ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, set, options);
    if (ret) {
        lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        return ret;
    }

    /* ('|' PathExpr)* */
    while (op_exp) {
        LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
               print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
        ++(*exp_idx);

        op_exp = exp_repeat_peek(exp, *exp_idx);
        if (op_exp && (exp->tokens[op_exp] == LYXP_TOKEN_OPERATOR_UNI)) {
            /* there is another operator */
            exp_repeat_pop(exp, *exp_idx);
        } else {
            op_exp = 0;
        }

        if (!set) {
            ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
            if (ret) {
                return ret;
            }
            continue;
        }

        set_fill_set(&set2, &orig_set);
        ret = eval_path_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        /* eval */
        if (options & LYXP_SNODE_ALL) {
            set_snode_merge(set, &set2);
        } else if (moveto_union(set, &set2, cur_node, options)) {
            lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return -1;
        }
    }

    lyxp_set_cast(&orig_set, LYXP_SET_EMPTY, cur_node, local_mod, options);
    /* now we have all the unions in set and no other memory allocated */

    if (set && (unary_minus > -1) && !(options & LYXP_SNODE_ALL)) {
        if (moveto_op_math(set, NULL, &exp->expr[exp->expr_pos[unary_minus]], cur_node, local_mod, options)) {
            return -1;
        }
    }

    return EXIT_SUCCESS;
}